

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall
BasePort::WriteBlock(BasePort *this,uchar boardId,nodeaddr_t addr,quadlet_t *wdata,uint nbytes)

{
  nodeid_t nVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  void *this_00;
  byte local_51;
  nodeid_t node;
  uint nbytes_local;
  quadlet_t *wdata_local;
  nodeaddr_t addr_local;
  uchar boardId_local;
  BasePort *this_local;
  
  if (nbytes == 4) {
    iVar2 = (*this->_vptr_BasePort[0x24])(this,(ulong)boardId,addr,(ulong)*wdata);
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  else if ((nbytes == 0) || ((nbytes & 3) != 0)) {
    poVar4 = std::operator<<(this->outStr,"BasePort::WriteBlock: illegal size (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,nbytes);
    poVar4 = std::operator<<(poVar4,"), must be multiple of 4");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    uVar3 = (*this->_vptr_BasePort[0x1a])();
    if (uVar3 < nbytes) {
      poVar4 = std::operator<<(this->outStr,"BasePort::WriteBlock: packet size ");
      this_00 = (void *)std::ostream::operator<<(poVar4,std::dec);
      poVar4 = (ostream *)std::ostream::operator<<(this_00,nbytes);
      poVar4 = std::operator<<(poVar4," too large (max = ");
      uVar3 = (*this->_vptr_BasePort[0x1a])();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
      poVar4 = std::operator<<(poVar4," bytes)");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      nVar1 = ConvertBoardToNode(this,boardId);
      if (nVar1 < 0x40) {
        iVar2 = (*this->_vptr_BasePort[6])
                          (this,(ulong)nVar1,addr,wdata,(ulong)nbytes,(ulong)(boardId & 0xc0));
        local_51 = (byte)iVar2;
      }
      else {
        local_51 = 0;
      }
      this_local._7_1_ = (bool)(local_51 & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BasePort::WriteBlock(unsigned char boardId, nodeaddr_t addr, quadlet_t *wdata,
                              unsigned int nbytes)
{
    if (nbytes == 4) {
        return WriteQuadlet(boardId, addr, *wdata);
    }
    else if ((nbytes == 0) || ((nbytes%4) != 0)) {
        outStr << "BasePort::WriteBlock: illegal size (" << nbytes << "), must be multiple of 4" << std::endl;
        return false;
    }
    else if (nbytes > GetMaxWriteDataSize()) {
        outStr << "BasePort::WriteBlock: packet size " << std::dec << nbytes << " too large (max = "
               << GetMaxWriteDataSize() << " bytes)" << std::endl;
        return false;
    }

    nodeid_t node = ConvertBoardToNode(boardId);
    return (node < MAX_NODES) ? WriteBlockNode(node, addr, wdata, nbytes, boardId&FW_NODE_FLAGS_MASK) : false;
}